

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 CalcSizeAutoFit(ImGuiWindow *window,ImVec2 *size_contents)

{
  ImGuiIO *pIVar1;
  ImVec2 *lhs;
  ImVec2 IVar2;
  float local_50;
  float fStack_4c;
  ImVec2 size_auto_fit_after_constraint;
  ImVec2 local_40;
  ImVec2 local_38;
  ImGuiStyle *local_30;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImVec2 *size_contents_local;
  ImGuiWindow *window_local;
  ImVec2 size_auto_fit;
  
  style = (ImGuiStyle *)GImGui;
  local_30 = &GImGui->Style;
  if ((window->Flags & 0x2000000U) == 0) {
    lhs = &(GImGui->Style).WindowMinSize;
    pIVar1 = &GImGui->IO;
    g = (ImGuiContext *)size_contents;
    size_contents_local = (ImVec2 *)window;
    size_auto_fit_after_constraint = operator*(&(GImGui->Style).DisplaySafeAreaPadding,2.0);
    local_40 = operator-(&pIVar1->DisplaySize,&size_auto_fit_after_constraint);
    local_38 = ImMax(lhs,&local_40);
    window_local = (ImGuiWindow *)ImClamp(size_contents,lhs,local_38);
    IVar2 = CalcSizeAfterConstraint((ImGuiWindow *)size_contents_local,(ImVec2)window_local);
    local_50 = IVar2.x;
    if (((local_50 < *(float *)g) && (((uint)size_contents_local[1].y & 8) == 0)) &&
       (((uint)size_contents_local[1].y & 0x800) != 0)) {
      window_local = (ImGuiWindow *)
                     CONCAT44(local_30->ScrollbarSize + window_local._4_4_,window_local._0_4_);
    }
    fStack_4c = IVar2.y;
    if ((fStack_4c < *(float *)&g->field_0x4) && (((uint)size_contents_local[1].y & 8) == 0)) {
      window_local = (ImGuiWindow *)
                     CONCAT44(window_local._4_4_,local_30->ScrollbarSize + window_local._0_4_);
    }
  }
  else {
    window_local = *(ImGuiWindow **)size_contents;
  }
  return (ImVec2)window_local;
}

Assistant:

static ImVec2 CalcSizeAutoFit(ImGuiWindow* window, const ImVec2& size_contents)
{
    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;
    if (window->Flags & ImGuiWindowFlags_Tooltip)
    {
        // Tooltip always resize
        return size_contents;
    }
    else
    {
        // When the window cannot fit all contents (either because of constraints, either because screen is too small): we are growing the size on the other axis to compensate for expected scrollbar. FIXME: Might turn bigger than DisplaySize-WindowPadding.
        ImVec2 size_auto_fit = ImClamp(size_contents, style.WindowMinSize, ImMax(style.WindowMinSize, g.IO.DisplaySize - g.Style.DisplaySafeAreaPadding * 2.0f));
        ImVec2 size_auto_fit_after_constraint = CalcSizeAfterConstraint(window, size_auto_fit);
        if (size_auto_fit_after_constraint.x < size_contents.x && !(window->Flags & ImGuiWindowFlags_NoScrollbar) && (window->Flags & ImGuiWindowFlags_HorizontalScrollbar))
            size_auto_fit.y += style.ScrollbarSize;
        if (size_auto_fit_after_constraint.y < size_contents.y && !(window->Flags & ImGuiWindowFlags_NoScrollbar))
            size_auto_fit.x += style.ScrollbarSize;
        return size_auto_fit;
    }
}